

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

ssize_t __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  RpcConnectionState *pRVar2;
  RpcClient *pRVar3;
  void *pvVar4;
  undefined8 uVar5;
  PointerReader other;
  PromiseNode *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t sVar9;
  TransformPromiseNodeBase *this_00;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  RpcRequest *this_01;
  int __flags_00;
  anon_union_344_2_a774ebf0_for_OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,_kj::Exception>_3
  *other_00;
  MessageSizeCounts MVar10;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> OVar11;
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
  forkedPromise;
  Own<kj::_::PromiseNode> local_368;
  undefined1 local_358 [48];
  undefined1 local_328 [352];
  undefined1 local_1c8 [24];
  Exception local_1b0;
  StructBuilder local_58;
  
  this_01 = (RpcRequest *)CONCAT44(in_register_00000034,__fd);
  pRVar2 = (this_01->connectionState).ptr;
  if ((pRVar2->connection).tag == 1) {
    pRVar3 = (this_01->target).ptr;
    local_328._16_8_ = (this_01->callBuilder)._builder.pointers;
    local_328._0_8_ = (this_01->callBuilder)._builder.segment;
    local_328._8_8_ = (this_01->callBuilder)._builder.capTable;
    PointerBuilder::getStruct(&local_58,(PointerBuilder *)local_328,(StructSize)0x10001,(word *)0x0)
    ;
    (*(pRVar3->super_ClientHook)._vptr_ClientHook[8])(local_328,pRVar3);
    uVar8 = local_328._8_8_;
    uVar7 = local_328._0_8_;
    if ((QuestionRef *)local_328._8_8_ == (QuestionRef *)0x0) {
      sendInternal((SendInternalResult *)local_328,this_01,false);
      kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::fork
                ((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)&local_1b0);
      sVar9 = local_1b0.ownFile.content.size_;
      pRVar2 = (this_01->connectionState).ptr;
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)&local_368);
      OVar11 = kj::
               refcounted<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline,capnp::_::(anonymous_namespace)::RpcConnectionState&,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>>
                         ((RpcConnectionState *)local_358,
                          (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *)
                          pRVar2,(Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                                  *)local_328);
      pPVar6 = local_368.ptr;
      if (local_368.ptr != (PromiseNode *)0x0) {
        local_368.ptr = (PromiseNode *)0x0;
        (**(local_368.disposer)->_vptr_Disposer)
                  (local_368.disposer,
                   (_func_int *)
                   ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]),
                   OVar11.ptr);
      }
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)&local_368);
      this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_368,
                 kj::_::
                 TransformPromiseNode<capnp::Response<capnp::AnyPointer>,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:1430:13),_kj::_::PropagateException>
                 ::anon_class_1_0_00000001_for_func::operator());
      pPVar6 = local_368.ptr;
      (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00620f68;
      if (local_368.ptr != (PromiseNode *)0x0) {
        local_368.ptr = (PromiseNode *)0x0;
        (**(local_368.disposer)->_vptr_Disposer)
                  (local_368.disposer,
                   (_func_int *)
                   ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]));
      }
      (this->super_RequestHook)._vptr_RequestHook =
           (_func_int **)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
            ::instance;
      (this->connectionState).disposer = (Disposer *)this_00;
      (this->connectionState).ptr = (RpcConnectionState *)local_358._0_8_;
      (this->target).disposer = (Disposer *)local_358._8_8_;
      (this->target).ptr = (RpcClient *)0x0;
      (this->message).disposer = (Disposer *)0x0;
      (this->message).ptr = (OutgoingRpcMessage *)0x0;
      if ((Disposer *)sVar9 != (Disposer *)0x0) {
        local_1b0.ownFile.content.size_ = 0;
        (***(_func_int ***)local_1b0.ownFile.content.ptr)
                  (local_1b0.ownFile.content.ptr,
                   (*(_func_int ***)sVar9)[-2] + (long)(_func_int ***)sVar9);
      }
      uVar7 = local_328._24_8_;
      if ((PromiseNode *)local_328._24_8_ != (PromiseNode *)0x0) {
        local_328._24_8_ = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)(WireValue<uint32_t>_conflict *)local_328._16_8_)
                  (local_328._16_8_,(*(_func_int ***)uVar7)[-2] + (long)(_func_int ***)uVar7);
      }
      uVar7 = local_328._8_8_;
      if ((QuestionRef *)local_328._8_8_ != (QuestionRef *)0x0) {
        local_328._8_8_ = (QuestionRef *)0x0;
        (*(code *)**(undefined8 **)local_328._0_8_)
                  (local_328._0_8_,(*(_func_int ***)uVar7)[-2] + uVar7);
      }
    }
    else {
      pvVar4 = (this_01->callBuilder)._builder.data;
      uVar5 = *(undefined8 *)((long)pvVar4 + 8);
      uVar1 = *(ushort *)((long)pvVar4 + 4);
      PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
      MVar10 = PointerReader::targetSize((PointerReader *)&local_1b0);
      local_1c8._8_8_ = MVar10.wordCount;
      __flags_00 = (int)local_1c8;
      local_1c8[0] = '\x01';
      local_1c8._16_4_ = MVar10.capCount;
      __n_00 = (size_t)uVar1;
      (***(_func_int ***)uVar8)(local_328,uVar8,uVar5);
      PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
      other.capTable._0_4_ = (int)local_358._24_8_;
      other.segment = (SegmentReader *)local_358._16_8_;
      other.capTable._4_4_ = SUB84(local_358._24_8_,4);
      other.pointer._0_4_ = (int)local_358._32_8_;
      other.pointer._4_4_ = SUB84(local_358._32_8_,4);
      other.nestingLimit = (int)local_358._40_8_;
      other._28_4_ = SUB84(local_358._40_8_,4);
      PointerBuilder::copyFrom((PointerBuilder *)local_328,other,false);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::send
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)local_328,__buf_00,
                 __n_00,__flags_00);
      uVar5 = local_328._32_8_;
      if ((long *)local_328._32_8_ != (long *)0x0) {
        local_328._32_8_ = (long *)0x0;
        (***(_func_int ***)local_328._24_8_)
                  (local_328._24_8_,uVar5 + *(long *)(*(long *)uVar5 + -0x10));
      }
      (*(code *)**(undefined8 **)uVar7)(uVar7,(*(_func_int ***)uVar8)[-2] + uVar8);
    }
  }
  else {
    other_00 = &(pRVar2->connection).field_1;
    kj::Exception::Exception((Exception *)local_328,(Exception *)other_00);
    kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>
              ((kj *)&local_1b0,(Exception *)local_328);
    kj::Exception::Exception(&local_1b0,(Exception *)other_00);
    newBrokenPipeline((capnp *)local_358,&local_1b0);
    uVar7 = local_358._8_8_;
    (this->super_RequestHook)._vptr_RequestHook = (_func_int **)local_1b0.ownFile.content.ptr;
    (this->connectionState).disposer = (Disposer *)local_1b0.ownFile.content.size_;
    local_358._8_8_ = (_func_int **)0x0;
    (this->connectionState).ptr = (RpcConnectionState *)local_358._0_8_;
    (this->target).disposer = (Disposer *)uVar7;
    (this->target).ptr = (RpcClient *)0x0;
    (this->message).disposer = (Disposer *)0x0;
    (this->message).ptr = (OutgoingRpcMessage *)0x0;
    kj::Exception::~Exception(&local_1b0);
    kj::Exception::~Exception((Exception *)local_328);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_MAYBE(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->get()->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize());
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        auto sendResult = sendInternal(false);

        auto forkedPromise = sendResult.promise.fork();

        // The pipeline must get notified of resolution before the app does to maintain ordering.
        auto pipeline = kj::refcounted<RpcPipeline>(
            *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

        auto appPromise = forkedPromise.addBranch().then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }